

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O1

int __thiscall
QAccessibleAbstractScrollArea::indexOfChild
          (QAccessibleAbstractScrollArea *this,QAccessibleInterface *child)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  long in_FS_OFFSET;
  QWidgetList local_38;
  long local_20;
  long lVar6;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar6 = 0xffffffff;
  iVar5 = -1;
  if ((child == (QAccessibleInterface *)0x0) ||
     (lVar3 = (**(code **)(*(long *)child + 0x18))(child), lVar3 == 0)) goto LAB_005202b7;
  accessibleChildren(&local_38,this);
  lVar3 = (**(code **)(*(long *)child + 0x18))(child);
  if (lVar3 == 0) {
    lVar4 = 0;
  }
  else {
    lVar4 = 0;
    if ((*(byte *)(*(long *)(lVar3 + 8) + 0x30) & 1) != 0) {
      lVar4 = lVar3;
    }
  }
  if (local_38.d.size == 0) {
LAB_0052028f:
    iVar5 = -1;
  }
  else {
    lVar3 = -8;
    do {
      iVar5 = (int)lVar6;
      lVar1 = local_38.d.size * -8 + lVar3;
      if (lVar1 == -8) goto LAB_00520289;
      lVar6 = lVar3 + 8;
      lVar2 = lVar3 + 8;
      lVar3 = lVar6;
    } while (*(long *)((long)local_38.d.ptr + lVar2) != lVar4);
    iVar5 = (int)(lVar6 >> 3);
LAB_00520289:
    if (lVar1 == -8) goto LAB_0052028f;
  }
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,8,0x10);
    }
  }
LAB_005202b7:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return iVar5;
}

Assistant:

int QAccessibleAbstractScrollArea::indexOfChild(const QAccessibleInterface *child) const
{
    if (!child || !child->object())
        return -1;
    return accessibleChildren().indexOf(qobject_cast<QWidget *>(child->object()));
}